

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O2

int __thiscall
ring_buffer_base<cubeb_log_message>::enqueue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cubeb_log_message *destination;
  size_t count_00;
  
  iVar4 = (this->read_index_).super___atomic_base<int>._M_i;
  uVar1 = (this->write_index_).super___atomic_base<int>._M_i;
  iVar2 = this->capacity_;
  iVar3 = 0;
  if ((int)(uVar1 + 1) % iVar2 != iVar4) {
    iVar3 = 0;
    if (iVar4 <= (int)uVar1) {
      iVar3 = iVar2;
    }
    iVar3 = iVar3 + ~uVar1 + iVar4;
    if (count <= iVar3) {
      iVar3 = count;
    }
    iVar4 = iVar2 - uVar1;
    if (iVar3 < (int)(iVar2 - uVar1)) {
      iVar4 = iVar3;
    }
    destination = (this->data_)._M_t.
                  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                  .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl + (int)uVar1;
    count_00 = (size_t)iVar4;
    if (elements == (cubeb_log_message *)0x0) {
      ConstructDefault<cubeb_log_message>(destination,count_00);
      ConstructDefault<cubeb_log_message>
                ((this->data_)._M_t.
                 super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                 .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl,
                 (long)(iVar3 - iVar4));
    }
    else {
      Copy<cubeb_log_message>(destination,elements,count_00);
      Copy<cubeb_log_message>
                ((this->data_)._M_t.
                 super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                 .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl,elements + count_00
                 ,(long)(iVar3 - iVar4));
    }
    (this->write_index_).super___atomic_base<int>._M_i = (int)(uVar1 + iVar3) % this->capacity_;
  }
  return iVar3;
}

Assistant:

int enqueue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(producer_id);
#endif

    int rd_idx = read_index_.load(std::memory_order_relaxed);
    int wr_idx = write_index_.load(std::memory_order_relaxed);

    if (full_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_write = std::min(available_write_internal(rd_idx, wr_idx), count);

    /* First part, from the write index to the end of the array. */
    int first_part = std::min(storage_capacity() - wr_idx, to_write);
    /* Second part, from the beginning of the array */
    int second_part = to_write - first_part;

    if (elements) {
      Copy(data_.get() + wr_idx, elements, first_part);
      Copy(data_.get(), elements + first_part, second_part);
    } else {
      ConstructDefault(data_.get() + wr_idx, first_part);
      ConstructDefault(data_.get(), second_part);
    }

    write_index_.store(increment_index(wr_idx, to_write),
                       std::memory_order_release);

    return to_write;
  }